

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int SMPI_Bcast(void *buffer,int count,SMPI_Datatype datatype,int root,SMPI_Comm comm)

{
  string *hint;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  Comm *in_RDI;
  unsigned_long *in_R8;
  string *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  size_t in_stack_fffffffffffffe80;
  string *this;
  long *in_stack_fffffffffffffe88;
  Comm *in_stack_fffffffffffffe90;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [64];
  
  switch(in_EDX) {
  case 0:
    std::__cxx11::string::string(local_40);
    adios2::helper::Comm::Bcast<int>
              (in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_40);
    break;
  case 1:
    std::__cxx11::string::string(local_90);
    adios2::helper::Comm::Bcast<long>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_90);
    break;
  case 2:
    std::__cxx11::string::string(local_b0);
    adios2::helper::Comm::Bcast<unsigned_long>
              (in_RDI,in_R8,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_b0);
    break;
  case 3:
    std::__cxx11::string::string(local_70);
    adios2::helper::Comm::Bcast<char>
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
               ,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_70);
    break;
  case 4:
    hint = (string *)(long)in_ESI;
    this = local_d0;
    std::__cxx11::string::string(this);
    adios2::helper::Comm::Bcast<unsigned_char>
              (in_stack_fffffffffffffe90,(uchar *)in_stack_fffffffffffffe88,(size_t)this,in_ECX,hint
              );
    std::__cxx11::string::~string(local_d0);
  }
  return 0;
}

Assistant:

int SMPI_Bcast(void *buffer, int count, SMPI_Datatype datatype, int root, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type) comm->Bcast(static_cast<type *>(buffer), count, root)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}